

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O1

void __thiscall
soul::AST::StructDeclaration::StructDeclaration
          (StructDeclaration *this,Context *c,Identifier structName)

{
  SourceCodeText *pSVar1;
  
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__ASTObject_00301658;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.objectType =
       StructDeclaration;
  pSVar1 = (c->location).sourceCode.object;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  location.sourceCode.object = pSVar1;
  if (pSVar1 != (SourceCodeText *)0x0) {
    (pSVar1->super_RefCountedObject).refCount = (pSVar1->super_RefCountedObject).refCount + 1;
  }
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  location.location.data = (c->location).location.data;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject.context.
  parentScope = c->parentScope;
  (this->super_TypeDeclarationBase).super_Expression.kind = type;
  (this->super_TypeDeclarationBase).name.name = structName.name;
  (this->super_TypeDeclarationBase).super_Expression.super_Statement.super_ASTObject._vptr_ASTObject
       = (_func_int **)&PTR__StructDeclaration_00302d48;
  (this->structure).object = (Structure *)0x0;
  (this->members).items = (Member *)(this->members).space;
  (this->members).numActive = 0;
  (this->members).numAllocated = 0x10;
  this->isBeingResolved = false;
  return;
}

Assistant:

ASTObject (ObjectType ot, const Context& c) : objectType (ot), context (c) {}